

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O2

void testing::internal::ContainerPrinter::PrintValue<QString,void>(QString *container,ostream *os)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  QChar *value;
  
  std::operator<<(os,'{');
  value = (QChar *)(container->d).ptr;
  uVar1 = (container->d).size;
  lVar3 = uVar1 * 2;
  lVar2 = 0;
  do {
    if (lVar3 == 0) {
      if ((uVar1 & 0x7fffffffffffffff) != 0) {
LAB_0010efd6:
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    if ((lVar2 != 0) && (std::operator<<(os,','), lVar2 == 0x20)) {
      std::operator<<(os," ...");
      goto LAB_0010efd6;
    }
    std::operator<<(os,' ');
    RawBytesPrinter::PrintValue<QChar,2ul>(value,os);
    lVar2 = lVar2 + 1;
    value = value + 1;
    lVar3 = lVar3 + -2;
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }